

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial_device.cpp
# Opt level: O0

Vec3fa embree::getTextureTexel3f(Texture *texture,float s,float t)

{
  long lVar1;
  int iVar2;
  uint *in_RSI;
  float *in_RDI;
  float in_XMM0_Da;
  float fVar3;
  float in_XMM1_Da;
  ulong uVar4;
  Vec3fa VVar5;
  uchar b;
  uchar g;
  uchar r;
  uchar *t_1;
  int offset;
  int iv;
  int iu;
  uint local_d8;
  uint local_d4;
  float local_68;
  float local_28;
  float fStack_24;
  
  if (in_RSI == (uint *)0x0) {
    uVar4 = 0;
    local_28 = 0.0;
    fStack_24 = 0.0;
    *in_RDI = 0.0;
    in_RDI[1] = 0.0;
    in_RDI[2] = 0.0;
    in_RDI[3] = 0.0;
  }
  else {
    fVar3 = floorf(in_XMM0_Da * (float)*in_RSI);
    local_d4 = (uint)(int)fVar3 % *in_RSI;
    if ((int)local_d4 < 0) {
      local_d4 = *in_RSI + local_d4;
    }
    fVar3 = floorf(in_XMM1_Da * (float)in_RSI[1]);
    local_d8 = (uint)(int)fVar3 % in_RSI[1];
    if ((int)local_d8 < 0) {
      local_d8 = in_RSI[1] + local_d8;
    }
    if (in_RSI[2] == 1) {
      iVar2 = (local_d8 * *in_RSI + local_d4) * 4;
      lVar1 = *(long *)(in_RSI + 6);
      local_28 = (float)*(byte *)(lVar1 + iVar2) / 255.0;
      fStack_24 = (float)*(byte *)((long)iVar2 + 1 + lVar1) / 255.0;
      fVar3 = (float)*(byte *)((long)iVar2 + 2 + lVar1) / 255.0;
      uVar4 = (ulong)(uint)fVar3;
      *in_RDI = local_28;
      in_RDI[1] = fStack_24;
      in_RDI[2] = fVar3;
      in_RDI[3] = 0.0;
    }
    else {
      uVar4 = 0;
      local_68 = 0.0;
      fStack_24 = 0.0;
      *in_RDI = 0.0;
      in_RDI[1] = 0.0;
      in_RDI[2] = 0.0;
      in_RDI[3] = 0.0;
      local_28 = local_68;
    }
  }
  VVar5.field_0.m128[1] = fStack_24;
  VVar5.field_0.m128[0] = local_28;
  VVar5.field_0._8_8_ = uVar4;
  return (Vec3fa)VVar5.field_0;
}

Assistant:

Vec3fa getTextureTexel3f(const Texture* texture, float s, float t)
{
  if (!texture) return Vec3fa(0.0f,0.0f,0.0f);

  int iu = (int)floor(s * (float)(texture->width));
  iu = iu % texture->width; if (iu < 0) iu += texture->width;
  int iv = (int)floor(t * (float)(texture->height));
  iv = iv % texture->height; if (iv < 0) iv += texture->height;

  if (texture->format == Texture::RGBA8)
  {
    const int offset = (iv * texture->width + iu) * 4;
    unsigned char * t = (unsigned char*)texture->data;
    const unsigned char  r = t[offset+0];
    const unsigned char  g = t[offset+1];
    const unsigned char  b = t[offset+2];
    return Vec3fa(  (float)r * 1.0f/255.0f, (float)g * 1.0f/255.0f, (float)b * 1.0f/255.0f );
  }
  return Vec3fa(0.0f,0.0f,0.0f);
}